

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall
llvm::yaml::Scanner::Scanner
          (Scanner *this,StringRef Input,SourceMgr *sm,bool ShowColors,error_code *EC)

{
  StringRef Buffer;
  Scanner *ctx;
  StringRef local_88;
  Scanner *local_78;
  char *pcStack_70;
  MemoryBufferRef local_68;
  error_code *local_38;
  error_code *EC_local;
  SourceMgr *pSStack_28;
  bool ShowColors_local;
  SourceMgr *sm_local;
  Scanner *this_local;
  StringRef Input_local;
  
  Input_local.Data = (char *)Input.Length;
  this_local = (Scanner *)Input.Data;
  this->SM = sm;
  local_38 = EC;
  EC_local._7_1_ = ShowColors;
  pSStack_28 = sm;
  sm_local = (SourceMgr *)this;
  MemoryBufferRef::MemoryBufferRef(&this->InputBuffer);
  this->ShowColors = (bool)(EC_local._7_1_ & 1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::AllocatorList(&this->TokenQueue);
  SmallVector<int,_4U>::SmallVector(&this->Indents);
  SmallVector<(anonymous_namespace)::SimpleKey,_4U>::SmallVector(&this->SimpleKeys);
  this->EC = local_38;
  local_78 = this_local;
  pcStack_70 = Input_local.Data;
  StringRef::StringRef(&local_88,"YAML");
  Buffer.Length = (size_t)pcStack_70;
  Buffer.Data = (char *)local_78;
  ctx = local_78;
  MemoryBufferRef::MemoryBufferRef(&local_68,Buffer,local_88);
  init(this,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

Scanner::Scanner(StringRef Input, SourceMgr &sm, bool ShowColors,
                 std::error_code *EC)
    : SM(sm), ShowColors(ShowColors), EC(EC) {
  init(MemoryBufferRef(Input, "YAML"));
}